

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O1

char * get_ptypes(short *S,vrna_md_t *md,uint idx_type)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int *__ptr;
  long lVar5;
  long lVar6;
  ulong uVar7;
  short *psVar8;
  short *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint length;
  int iVar19;
  long lVar20;
  long lVar21;
  
  if (S == (short *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    length = (uint)*S;
    if (*S < 0) {
      pcVar4 = (char *)0x0;
      vrna_message_warning
                ("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                 (ulong)length);
    }
    else {
      if (idx_type == 0) {
        pcVar4 = vrna_ptypes(S,md);
        return pcVar4;
      }
      pcVar4 = (char *)vrna_alloc(((length + 1) * length >> 1) + 2);
      __ptr = vrna_idx_row_wise(length);
      iVar1 = md->min_loop_size;
      if (1 < (int)(length - iVar1)) {
        lVar10 = (long)(iVar1 + 2);
        lVar12 = (long)(int)length;
        psVar8 = S + lVar10;
        lVar16 = (long)pcVar4 - lVar10;
        uVar7 = 1;
        do {
          psVar8 = psVar8 + 1;
          lVar21 = 1;
          psVar9 = psVar8;
          lVar11 = lVar10;
          lVar17 = lVar16;
          do {
            lVar5 = (long)iVar1 + uVar7 + lVar21;
            if (lVar5 <= lVar12) {
              lVar6 = 0;
              iVar13 = 0;
              iVar15 = 0;
              uVar18 = uVar7;
              lVar20 = lVar17;
              iVar19 = md->pair[S[uVar7]][S[lVar5]];
              do {
                bVar3 = 1 < (long)uVar18;
                bVar2 = lVar11 + lVar6 < lVar12;
                if (bVar2 && bVar3) {
                  iVar15 = md->pair[S[uVar18 - 1]][psVar9[lVar6]];
                }
                iVar14 = 0;
                if (iVar13 != 0 || iVar15 != 0) {
                  iVar14 = iVar19;
                }
                iVar13 = iVar14;
                if (md->noLP == 0) {
                  iVar13 = iVar19;
                }
                *(char *)(lVar20 + __ptr[uVar18]) = (char)iVar13;
                uVar18 = uVar18 - 1;
                lVar6 = lVar6 + 1;
                lVar20 = lVar20 + -1;
                iVar19 = iVar15;
              } while (bVar2 && bVar3);
            }
            lVar21 = lVar21 + 1;
            lVar11 = lVar11 + 1;
            psVar9 = psVar9 + 1;
            lVar17 = lVar17 + -1;
          } while (lVar21 != 3);
          uVar7 = uVar7 + 1;
          lVar10 = lVar10 + 1;
          lVar16 = lVar16 + -1;
        } while (uVar7 != length - iVar1);
      }
      free(__ptr);
    }
  }
  return pcVar4;
}

Assistant:

PUBLIC char *
get_ptypes(const short  *S,
           vrna_md_t    *md,
           unsigned int idx_type)
{
  if (S) {
    if ((unsigned int)S[0] > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
      vrna_message_warning("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                           (int)S[0]);
      return NULL;
    }

    if (idx_type)
      return wrap_get_ptypes(S, md);
    else
      return vrna_ptypes(S, md);
  } else {
    return NULL;
  }
}